

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * substExpr(SubstContext *pSubst,Expr *pExpr)

{
  byte *pbVar1;
  u8 uVar2;
  sqlite3 *db;
  SrcList *pSVar3;
  Expr *pEVar4;
  u8 uVar5;
  Select *pSVar6;
  Expr *p;
  SrcList **ppSVar7;
  long lVar8;
  Expr ifNullRow;
  Expr local_78;
  
  if (pExpr == (Expr *)0x0) {
    return (Expr *)0x0;
  }
  if (((pExpr->flags & 1) != 0) && (pSubst->iTable == (int)pExpr->iRightJoinTable)) {
    pExpr->iRightJoinTable = (i16)pSubst->iNewTable;
  }
  if (pExpr->op == 0xab) {
    if (pExpr->iTable == pSubst->iTable) {
      pExpr->iTable = pSubst->iNewTable;
    }
LAB_0017e3de:
    pEVar4 = substExpr(pSubst,pExpr->pLeft);
    pExpr->pLeft = pEVar4;
    pEVar4 = substExpr(pSubst,pExpr->pRight);
    pExpr->pRight = pEVar4;
    pSVar6 = (Select *)(pExpr->x).pList;
    if ((pExpr->flags & 0x800) == 0) {
      if ((pSVar6 != (Select *)0x0) && (0 < *(int *)&pSVar6->pEList)) {
        ppSVar7 = (SrcList **)&pSVar6->op;
        lVar8 = 0;
        do {
          pSVar3 = (SrcList *)substExpr(pSubst,(Expr *)*ppSVar7);
          *ppSVar7 = pSVar3;
          lVar8 = lVar8 + 1;
          ppSVar7 = ppSVar7 + 4;
        } while (lVar8 < *(int *)&pSVar6->pEList);
      }
    }
    else {
      substSelect(pSubst,pSVar6,1);
    }
    return pExpr;
  }
  if ((pExpr->op != 0xa2) || (pExpr->iTable != pSubst->iTable)) goto LAB_0017e3de;
  if ((long)pExpr->iColumn < 0) {
    pExpr->op = 'r';
    return pExpr;
  }
  pEVar4 = pSubst->pEList->a[pExpr->iColumn].pExpr;
  uVar2 = pEVar4->op;
  uVar5 = uVar2;
  if (uVar2 == 0xa8) {
    uVar5 = pEVar4->op2;
  }
  if (uVar5 == 0x83) {
    pSVar6 = (pEVar4->x).pSelect;
  }
  else {
    if (uVar5 != 0xa9) goto LAB_0017e471;
    pSVar6 = (Select *)&pEVar4->x;
  }
  if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar6->pEList)->pList->nExpr) {
    sqlite3VectorErrorMsg(pSubst->pParse,pEVar4);
    return pExpr;
  }
LAB_0017e471:
  db = pSubst->pParse->db;
  p = pEVar4;
  if ((uVar2 != 0xa2) && (pSubst->isLeftJoin != 0)) {
    local_78.u.zToken = (char *)0x0;
    local_78.pRight = (Expr *)0x0;
    local_78.iColumn = 0;
    local_78.iAgg = 0;
    local_78.iRightJoinTable = 0;
    local_78.op2 = '\0';
    local_78._55_1_ = 0;
    local_78.pAggInfo = (AggInfo *)0x0;
    local_78.x.pList = (ExprList *)0x0;
    local_78.y.pTab = (Table *)0x0;
    local_78.op = 0xab;
    local_78.affinity = '\0';
    local_78._2_2_ = 0;
    local_78.flags = 0;
    local_78._40_8_ = (ulong)(uint)pSubst->iNewTable << 0x20;
    p = &local_78;
    local_78.pLeft = pEVar4;
  }
  pEVar4 = exprDup(db,p,0,(u8 **)0x0);
  if (pEVar4 != (Expr *)0x0) {
    if (pSubst->isLeftJoin != 0) {
      pbVar1 = (byte *)((long)&pEVar4->flags + 2);
      *pbVar1 = *pbVar1 | 0x10;
    }
    if ((pExpr->flags & 1) != 0) {
      pEVar4->iRightJoinTable = pExpr->iRightJoinTable;
      *(byte *)&pEVar4->flags = (byte)pEVar4->flags | 1;
    }
  }
  sqlite3ExprDeleteNN(db,pExpr);
  return pEVar4;
}

Assistant:

static Expr *substExpr(
  SubstContext *pSubst,  /* Description of the substitution */
  Expr *pExpr            /* Expr in which substitution occurs */
){
  if( pExpr==0 ) return 0;
  if( ExprHasProperty(pExpr, EP_FromJoin)
   && pExpr->iRightJoinTable==pSubst->iTable
  ){
    pExpr->iRightJoinTable = pSubst->iNewTable;
  }
  if( pExpr->op==TK_COLUMN && pExpr->iTable==pSubst->iTable ){
    if( pExpr->iColumn<0 ){
      pExpr->op = TK_NULL;
    }else{
      Expr *pNew;
      Expr *pCopy = pSubst->pEList->a[pExpr->iColumn].pExpr;
      Expr ifNullRow;
      assert( pSubst->pEList!=0 && pExpr->iColumn<pSubst->pEList->nExpr );
      assert( pExpr->pRight==0 );
      if( sqlite3ExprIsVector(pCopy) ){
        sqlite3VectorErrorMsg(pSubst->pParse, pCopy);
      }else{
        sqlite3 *db = pSubst->pParse->db;
        if( pSubst->isLeftJoin && pCopy->op!=TK_COLUMN ){
          memset(&ifNullRow, 0, sizeof(ifNullRow));
          ifNullRow.op = TK_IF_NULL_ROW;
          ifNullRow.pLeft = pCopy;
          ifNullRow.iTable = pSubst->iNewTable;
          pCopy = &ifNullRow;
        }
        testcase( ExprHasProperty(pCopy, EP_Subquery) );
        pNew = sqlite3ExprDup(db, pCopy, 0);
        if( pNew && pSubst->isLeftJoin ){
          ExprSetProperty(pNew, EP_CanBeNull);
        }
        if( pNew && ExprHasProperty(pExpr,EP_FromJoin) ){
          pNew->iRightJoinTable = pExpr->iRightJoinTable;
          ExprSetProperty(pNew, EP_FromJoin);
        }
        sqlite3ExprDelete(db, pExpr);
        pExpr = pNew;
      }
    }
  }else{
    if( pExpr->op==TK_IF_NULL_ROW && pExpr->iTable==pSubst->iTable ){
      pExpr->iTable = pSubst->iNewTable;
    }
    pExpr->pLeft = substExpr(pSubst, pExpr->pLeft);
    pExpr->pRight = substExpr(pSubst, pExpr->pRight);
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      substSelect(pSubst, pExpr->x.pSelect, 1);
    }else{
      substExprList(pSubst, pExpr->x.pList);
    }
  }
  return pExpr;
}